

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

UnicodeString * icu_63::getDateTimeString(UDate time,UnicodeString *str)

{
  ushort uVar1;
  ushort uVar2;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  UChar local_42;
  int local_40;
  int32_t local_3c;
  int32_t local_38;
  int32_t local_34;
  int local_30;
  int32_t local_2c;
  
  Grego::timeToFields(time,&local_2c,&local_30,&local_34,&local_38,&local_3c,&local_40);
  uVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  uVar2 = uVar1 & 0x1e;
  if ((uVar1 & 1) != 0) {
    uVar2 = 2;
  }
  (str->fUnion).fStackFields.fLengthAndFlags = uVar2;
  appendAsciiDigits(local_2c,'\x04',str);
  appendAsciiDigits(local_30 + 1,'\x02',str);
  appendAsciiDigits(local_34,'\x02',str);
  local_42 = L'T';
  UnicodeString::doAppend(str,&local_42,0,1);
  appendAsciiDigits(local_40 / 3600000,'\x02',str);
  appendAsciiDigits((local_40 % 3600000) / 60000,'\x02',str);
  appendAsciiDigits(((local_40 % 3600000) % 60000) / 1000,'\x02',str);
  return str;
}

Assistant:

static UnicodeString& getDateTimeString(UDate time, UnicodeString& str) {
    int32_t year, month, dom, dow, doy, mid;
    Grego::timeToFields(time, year, month, dom, dow, doy, mid);

    str.remove();
    appendAsciiDigits(year, 4, str);
    appendAsciiDigits(month + 1, 2, str);
    appendAsciiDigits(dom, 2, str);
    str.append((UChar)0x0054 /*'T'*/);

    int32_t t = mid;
    int32_t hour = t / U_MILLIS_PER_HOUR;
    t %= U_MILLIS_PER_HOUR;
    int32_t min = t / U_MILLIS_PER_MINUTE;
    t %= U_MILLIS_PER_MINUTE;
    int32_t sec = t / U_MILLIS_PER_SECOND;

    appendAsciiDigits(hour, 2, str);
    appendAsciiDigits(min, 2, str);
    appendAsciiDigits(sec, 2, str);
    return str;
}